

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O1

void __thiscall just::temp::directory::directory(directory *this)

{
  char *pcVar1;
  char *__s;
  runtime_error *this_00;
  char tmp [17];
  char local_38 [24];
  
  (this->_path)._M_dataplus._M_p = (pointer)&(this->_path).field_2;
  (this->_path)._M_string_length = 0;
  (this->_path).field_2._M_local_buf[0] = '\0';
  builtin_strncpy(local_38,"/tmp/just-XXXXXX",0x11);
  __s = mkdtemp(local_38);
  if (__s != (char *)0x0) {
    pcVar1 = (char *)(this->_path)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)__s);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Error creating temporary directory");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

directory()
      {
#ifdef _WIN32
        const std::string temp_dir = get_temp_path();
        char tmp[MAX_PATH + 1];
        if (GetTempFileName(temp_dir.c_str(), "just-", 0, tmp))
        {
          if (DeleteFile(tmp))
          {
            if (CreateDirectory(tmp, NULL))
            {
              _path = tmp;
            }
            else
            {
              throw std::runtime_error("Error creating temporary directory");
            }
          }
          else
          {
            throw std::runtime_error("Error deleting temporary file");
          }
        }
        else
        {
          throw
            std::runtime_error(
              "Error choosing unique name for the temporary directory"
            );
        }
#else
        char tmp[] = "/tmp/just-XXXXXX";
        if (char* const p = mkdtemp(tmp))
        {
          _path = p;
        }
        else
        {
          throw std::runtime_error("Error creating temporary directory");
        }
#endif
      }